

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

DdNode * cuddSubsetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  int iVar1;
  AssortedInfo *info_00;
  st__table *psVar2;
  uint local_8c;
  st__table *local_88;
  st__table *subsetNodeTable;
  AssortedInfo *info;
  NodeDist_t *nodeStat;
  uint *puStack_68;
  int i;
  uint *excess;
  uint pathLength;
  uint evenLen;
  uint oddLen;
  uint maxpath;
  uint *pathLengthArray;
  DdNode *subset;
  DdNode *N;
  st__table *pathTable;
  int local_28;
  int hardlimit_local;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  pathTable._4_4_ = hardlimit;
  local_28 = threshold;
  hardlimit_local = numVars;
  _threshold_local = (DdManager *)f;
  f_local = &dd->sentinel;
  if (numVars == 0) {
    hardlimit_local = Cudd_ReadSize(dd);
  }
  if (hardlimit_local < local_28) {
    local_28 = local_28 - hardlimit_local;
  }
  if (_threshold_local == (DdManager *)0x0) {
    fprintf((FILE *)f_local[0xf].type.kids.T,"Cannot partition, nil object\n");
    *(undefined4 *)((long)&f_local[0xf].type + 8) = 4;
    dd_local = (DdManager *)0x0;
  }
  else if (*(int *)((ulong)_threshold_local & 0xfffffffffffffffe) == 0x7fffffff) {
    dd_local = _threshold_local;
  }
  else {
    _oddLen = (uint *)malloc((long)(hardlimit_local + 1) << 2);
    for (nodeStat._4_4_ = 0; nodeStat._4_4_ < hardlimit_local + 1;
        nodeStat._4_4_ = nodeStat._4_4_ + 1) {
      _oddLen[nodeStat._4_4_] = 0;
    }
    N = (DdNode *)
        CreatePathTable(&_threshold_local->sentinel,_oddLen,(FILE *)f_local[0xf].type.kids.T);
    if (((st__table *)N == (st__table *)0x0) || (memOut != 0)) {
      if ((st__table *)N != (st__table *)0x0) {
        st__free_table((st__table *)N);
      }
      if (_oddLen != (uint *)0x0) {
        free(_oddLen);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      puStack_68 = (uint *)malloc(4);
      *puStack_68 = 0;
      evenLen = AssessPathLength(_oddLen,local_28,hardlimit_local,puStack_68,
                                 (FILE *)f_local[0xf].type.kids.T);
      if (evenLen == hardlimit_local + 1U) {
        pathLengthArray = (uint *)_threshold_local;
        *(int *)(((ulong)_threshold_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)_threshold_local & 0xfffffffffffffffe) + 4) + 1;
      }
      else {
        info_00 = (AssortedInfo *)malloc(0x20);
        info_00->maxpath = evenLen;
        info_00->findShortestPath = 0;
        info_00->thresholdReached = *puStack_68;
        psVar2 = st__init_table(st__ptrcmp,st__ptrhash);
        info_00->maxpathTable = psVar2;
        info_00->threshold = local_28;
        subset = (DdNode *)((ulong)_threshold_local & 0xfffffffffffffffe);
        iVar1 = st__lookup((st__table *)N,(char *)subset,(char **)&info);
        if (iVar1 == 0) {
          fprintf((FILE *)f_local[0xf].type.kids.T,"Something wrong, root node must be in table\n");
          *(undefined4 *)((long)&f_local[0xf].type + 8) = 5;
          if (puStack_68 != (uint *)0x0) {
            free(puStack_68);
            puStack_68 = (uint *)0x0;
          }
          if (info_00 != (AssortedInfo *)0x0) {
            free(info_00);
          }
          return (DdNode *)0x0;
        }
        if ((info->maxpath == 0xffffffff) || (info->thresholdReached == -1)) {
          pathLength = 0xffffffff;
        }
        else {
          pathLength = info->maxpath + info->thresholdReached;
        }
        if ((info->findShortestPath == -1) || (*(int *)&info->field_0xc == -1)) {
          excess._4_4_ = 0xffffffff;
        }
        else {
          excess._4_4_ = info->findShortestPath + *(int *)&info->field_0xc;
        }
        if (excess._4_4_ < pathLength) {
          local_8c = excess._4_4_;
        }
        else {
          local_8c = pathLength;
        }
        excess._0_4_ = local_8c;
        if (evenLen < local_8c) {
          fprintf((FILE *)f_local[0xf].type.kids.T,
                  "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n"
                  ,(ulong)evenLen,(ulong)local_8c);
          *(undefined4 *)((long)&f_local[0xf].type + 8) = 5;
          return (DdNode *)0x0;
        }
        if (pathTable._4_4_ == 0) {
          local_88 = (st__table *)0x0;
        }
        else {
          local_88 = st__init_table(st__ptrcmp,st__ptrhash);
        }
        pathLengthArray =
             &BuildSubsetBdd((DdManager *)f_local,(st__table *)N,&_threshold_local->sentinel,info_00
                             ,local_88)->index;
        if ((DdNode *)pathLengthArray != (DdNode *)0x0) {
          *(int *)(((ulong)pathLengthArray & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pathLengthArray & 0xfffffffffffffffe) + 4) + 1;
        }
        if (local_88 != (st__table *)0x0) {
          st__free_table(local_88);
        }
        st__free_table(info_00->maxpathTable);
        st__foreach((st__table *)N,stPathTableDdFree,(char *)f_local);
        if (info_00 != (AssortedInfo *)0x0) {
          free(info_00);
        }
      }
      if (puStack_68 != (uint *)0x0) {
        free(puStack_68);
        puStack_68 = (uint *)0x0;
      }
      st__free_table((st__table *)N);
      if (_oddLen != (uint *)0x0) {
        free(_oddLen);
        _oddLen = (uint *)0x0;
      }
      for (nodeStat._4_4_ = 0; nodeStat._4_4_ <= nodeDistPage; nodeStat._4_4_ = nodeStat._4_4_ + 1)
      {
        if (nodeDistPages[nodeStat._4_4_] != (NodeDist_t *)0x0) {
          free(nodeDistPages[nodeStat._4_4_]);
          nodeDistPages[nodeStat._4_4_] = (NodeDist_t *)0x0;
        }
      }
      if (nodeDistPages != (NodeDist_t **)0x0) {
        free(nodeDistPages);
        nodeDistPages = (NodeDist_t **)0x0;
      }
      if (pathLengthArray == (uint *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pathLengthArray & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pathLengthArray & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)pathLengthArray;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddSubsetShortPaths(
  DdManager * dd /* DD manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* total number of variables in consideration */,
  int  threshold /* maximum number of nodes allowed in the subset */,
  int  hardlimit /* flag determining whether thershold should be respected strictly */)
{
    st__table *pathTable;
    DdNode *N, *subset;

    unsigned int  *pathLengthArray;
    unsigned int maxpath, oddLen, evenLen, pathLength, *excess;
    int i;
    NodeDist_t  *nodeStat;
    struct AssortedInfo *info;
    st__table *subsetNodeTable;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (numVars == 0) {
      /* set default value */
      numVars = Cudd_ReadSize(dd);
    }

    if (threshold > numVars) {
        threshold = threshold - numVars;
    }
    if (f == NULL) {
        fprintf(dd->err, "Cannot partition, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    if (Cudd_IsConstant(f))
        return (f);

    pathLengthArray = ABC_ALLOC(unsigned int, numVars+1);
    for (i = 0; i < numVars+1; i++) pathLengthArray[i] = 0;


#ifdef DD_DEBUG
    numCalls = 0;
#endif

    pathTable = CreatePathTable(f, pathLengthArray, dd->err);

    if ((pathTable == NULL) || (memOut)) {
        if (pathTable != NULL)
            st__free_table(pathTable);
        ABC_FREE(pathLengthArray);
        return (NIL(DdNode));
    }

    excess = ABC_ALLOC(unsigned int, 1);
    *excess = 0;
    maxpath = AssessPathLength(pathLengthArray, threshold, numVars, excess,
                               dd->err);

    if (maxpath != (unsigned) (numVars + 1)) {

        info = ABC_ALLOC(struct AssortedInfo, 1);
        info->maxpath = maxpath;
        info->findShortestPath = 0;
        info->thresholdReached = *excess;
        info->maxpathTable = st__init_table( st__ptrcmp, st__ptrhash);
        info->threshold = threshold;

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Path length array\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",i);
        }
        (void) fprintf(dd->out, "\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",pathLengthArray[i]);
        }
        (void) fprintf(dd->out, "\n");
        (void) fprintf(dd->out, "Maxpath  = %d, Thresholdreached = %d\n",
                       maxpath, info->thresholdReached);
#endif

        N = Cudd_Regular(f);
        if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
            fprintf(dd->err, "Something wrong, root node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            ABC_FREE(excess);
            ABC_FREE(info);
            return(NULL);
        } else {
            if ((nodeStat->oddTopDist != MAXSHORTINT) &&
                (nodeStat->oddBotDist != MAXSHORTINT))
                oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
            else
                oddLen = MAXSHORTINT;

            if ((nodeStat->evenTopDist != MAXSHORTINT) &&
                (nodeStat->evenBotDist != MAXSHORTINT))
                evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
            else
                evenLen = MAXSHORTINT;

            pathLength = (oddLen <= evenLen) ? oddLen : evenLen;
            if (pathLength > maxpath) {
                (void) fprintf(dd->err, "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n", maxpath, pathLength);
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        }

#ifdef DD_DEBUG
        numCalls = 0;
        hits = 0;
        thishit = 0;
#endif
        /* initialize a table to store computed nodes */
        if (hardlimit) {
            subsetNodeTable = st__init_table( st__ptrcmp, st__ptrhash);
        } else {
            subsetNodeTable = NIL( st__table);
        }
        subset = BuildSubsetBdd(dd, pathTable, f, info, subsetNodeTable);
        if (subset != NULL) {
            cuddRef(subset);
        }
        /* record the number of times a computed result for a node is hit */

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Hits = %d, New==Node = %d, NumCalls = %d\n",
                hits, thishit, numCalls);
#endif

        if (subsetNodeTable != NIL( st__table)) {
            st__free_table(subsetNodeTable);
        }
        st__free_table(info->maxpathTable);
        st__foreach(pathTable, stPathTableDdFree, (char *)dd);

        ABC_FREE(info);

    } else {/* if threshold larger than size of dd */
        subset = f;
        cuddRef(subset);
    }
    ABC_FREE(excess);
    st__free_table(pathTable);
    ABC_FREE(pathLengthArray);
    for (i = 0; i <= nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
    ABC_FREE(nodeDistPages);

#ifdef DD_DEBUG
    /* check containment of subset in f */
    if (subset != NULL) {
        DdNode *check;
        check = Cudd_bddIteConstant(dd, subset, f, one);
        if (check != one) {
            (void) fprintf(dd->err, "Wrong partition\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
    }
#endif

    if (subset != NULL) {
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }

}